

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPM2B_SENSITIVE_Unmarshal(TPM2B_SENSITIVE *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  TVar3 = 0x9a;
  if (1 < iVar1) {
    UVar2 = ByteArrayToUint16(*buffer);
    target->size = UVar2;
    *buffer = *buffer + 2;
    if (target->size == 0) {
      TVar3 = 0;
    }
    else {
      iVar1 = *size;
      TVar3 = TPMT_SENSITIVE_Unmarshal(&target->sensitiveArea,buffer,size);
      if ((TVar3 == 0) && (TVar3 = 0x95, iVar1 - *size == (uint)target->size)) {
        TVar3 = 0;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2B_SENSITIVE_Unmarshal(TPM2B_SENSITIVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    INT32    startSize;
    result = UINT16_Unmarshal((UINT16 *)&(target->size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    // if size equal to 0, the rest of the structure is a zero buffer.  Stop processing
    if(target->size == 0)
        return TPM_RC_SUCCESS;
    startSize = *size;
    result = TPMT_SENSITIVE_Unmarshal((TPMT_SENSITIVE *)&(target->sensitiveArea), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(target->size != (startSize - *size)) return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}